

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.h
# Opt level: O2

size_t __thiscall
Fixpp::
StreamBufBase<Fixpp::VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<'0'>,_Fixpp::TagT<112U,_Fixpp::Type::String>_>,_1024UL>
::checksum(StreamBufBase<Fixpp::VersionnedMessage<Fixpp::v42::Version,_Fixpp::Chars<_0_>,_Fixpp::TagT<112U,_Fixpp::Type::String>_>,_1024UL>
           *this)

{
  char *pcVar1;
  byte bVar2;
  
  bVar2 = 0;
  for (pcVar1 = (char *)(*(long *)&(this->super_SmallStreamBuf<1024UL,_char>).field_0x20 +
                        this->off_);
      pcVar1 != *(char **)&(this->super_SmallStreamBuf<1024UL,_char>).field_0x28;
      pcVar1 = pcVar1 + 1) {
    bVar2 = bVar2 + *pcVar1;
  }
  return (ulong)bVar2;
}

Assistant:

size_t checksum() const
        {
            const char* p = Base::pbase() + off_;
            const char* end = Base::pptr();

            size_t sum = 0;

            while (p != end)
            {
                sum += static_cast<size_t>(*p);
                ++p;
            }

            return sum % 256;
        }